

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiApi::MidiApi(MidiApi *this)

{
  this->_vptr_MidiApi = (_func_int **)&PTR__MidiOutApi_00115a88;
  this->apiData_ = (void *)0x0;
  this->connected_ = false;
  (this->errorString_)._M_dataplus._M_p = (pointer)&(this->errorString_).field_2;
  (this->errorString_)._M_string_length = 0;
  (this->errorString_).field_2._M_local_buf[0] = '\0';
  this->errorCallback_ = (RtMidiErrorCallback)0x0;
  this->firstErrorOccurred_ = false;
  this->errorCallbackUserData_ = (void *)0x0;
  return;
}

Assistant:

MidiApi :: MidiApi( void )
  : apiData_( 0 ), connected_( false ), errorCallback_(0), firstErrorOccurred_(false), errorCallbackUserData_(0)
{
}